

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_do(Curl_easy *data,_Bool *done)

{
  connectdata *pcVar1;
  
  pcVar1 = data->conn;
  *done = false;
  return (uint)((pcVar1->proto).ftpc.pp.linestart_resp == (char *)0x0) * 3;
}

Assistant:

static CURLcode smb_do(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;

  *done = FALSE;
  if(smbc->share) {
    return CURLE_OK;
  }
  return CURLE_URL_MALFORMAT;
}